

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockDXT.cpp
# Opt level: O2

void __thiscall nv::BlockATI1::decodeBlock(BlockATI1 *this,ColorBlock *block)

{
  uint8 uVar1;
  uint i;
  long lVar2;
  uint8 alpha_array [8];
  uint8 index_array [16];
  uint8 local_30 [8];
  byte local_28 [24];
  
  AlphaBlockDXT5::evaluatePalette(&this->alpha,local_30);
  AlphaBlockDXT5::indices(&this->alpha,local_28);
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    uVar1 = local_30[local_28[lVar2]];
    block->m_color[lVar2].field_0.field_0.r = uVar1;
    block->m_color[lVar2].field_0.field_0.g = uVar1;
    block->m_color[lVar2].field_0.field_0.b = uVar1;
    block->m_color[lVar2].field_0.field_0.a = 0xff;
  }
  return;
}

Assistant:

void BlockATI1::decodeBlock(ColorBlock * block) const
{
	uint8 alpha_array[8];
	alpha.evaluatePalette(alpha_array);
	
	uint8 index_array[16];
	alpha.indices(index_array);
	
	for(uint i = 0; i < 16; i++) {
		Color32 & c = block->color(i);
		c.b = c.g = c.r = alpha_array[index_array[i]];
		c.a = 255;
	}
}